

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O0

void __thiscall
icu_63::number::impl::DecimalQuantity::shiftRight(DecimalQuantity *this,int32_t numDigits)

{
  int local_18;
  int i;
  int32_t numDigits_local;
  DecimalQuantity *this_local;
  
  if ((this->usingBytes & 1U) == 0) {
    (this->fBCD).bcdLong = (this->fBCD).bcdLong >> ((byte)(numDigits << 2) & 0x3f);
  }
  else {
    for (local_18 = 0; local_18 < this->precision - numDigits; local_18 = local_18 + 1) {
      (this->fBCD).bcdBytes.ptr[local_18] = (this->fBCD).bcdBytes.ptr[local_18 + numDigits];
    }
    for (; local_18 < this->precision; local_18 = local_18 + 1) {
      (this->fBCD).bcdBytes.ptr[local_18] = '\0';
    }
  }
  this->scale = numDigits + this->scale;
  this->precision = this->precision - numDigits;
  return;
}

Assistant:

void DecimalQuantity::shiftRight(int32_t numDigits) {
    if (usingBytes) {
        int i = 0;
        for (; i < precision - numDigits; i++) {
            fBCD.bcdBytes.ptr[i] = fBCD.bcdBytes.ptr[i + numDigits];
        }
        for (; i < precision; i++) {
            fBCD.bcdBytes.ptr[i] = 0;
        }
    } else {
        fBCD.bcdLong >>= (numDigits * 4);
    }
    scale += numDigits;
    precision -= numDigits;
}